

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchic_fe.h
# Opt level: O0

MatrixXd * __thiscall
lf::fe::FeHierarchicQuad<double>::EvaluationNodes
          (MatrixXd *__return_storage_ptr__,FeHierarchicQuad<double> *this)

{
  const_reference pvVar1;
  const_reference ppQVar2;
  Scalar *pSVar3;
  reference peVar4;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pDVar5;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pMVar6;
  size_type local_4c4;
  size_type local_4c0;
  size_type local_4bc;
  size_type local_4b8;
  size_type local_4b4;
  Type local_498;
  Type local_460;
  uint local_424;
  undefined1 local_420 [4];
  size_type i;
  MatrixXd points;
  Type local_3d0;
  ConstantReturnType local_398;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_380;
  Type local_350;
  Type local_318;
  Type local_2e0;
  Type local_2a8;
  ConstantReturnType local_270;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_258;
  Type local_228;
  ConstantReturnType local_1f0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_1d8;
  Type local_1a8;
  Type local_170;
  Type local_138;
  Type local_100;
  ConstantReturnType local_c8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_b0;
  Type local_80;
  uint local_38 [2];
  undefined1 local_2d;
  size_type local_2c;
  size_type local_28;
  size_type Nq;
  size_type Ne3;
  size_type Ne2;
  size_type Ne1;
  size_type Ne0;
  FeHierarchicQuad<double> *this_local;
  MatrixXd *nodes;
  
  _Ne1 = this;
  this_local = (FeHierarchicQuad<double> *)__return_storage_ptr__;
  pvVar1 = std::array<unsigned_int,_4UL>::operator[](&this->edge_degrees_,0);
  if (*pvVar1 < 2) {
    local_4b4 = 0;
  }
  else {
    ppQVar2 = std::array<const_lf::quad::QuadRule_*,_4UL>::operator[](&this->qr_dual_edge_,0);
    local_4b4 = quad::QuadRule::NumPoints(*ppQVar2);
  }
  Ne2 = local_4b4;
  pvVar1 = std::array<unsigned_int,_4UL>::operator[](&this->edge_degrees_,1);
  if (*pvVar1 < 2) {
    local_4b8 = 0;
  }
  else {
    ppQVar2 = std::array<const_lf::quad::QuadRule_*,_4UL>::operator[](&this->qr_dual_edge_,1);
    local_4b8 = quad::QuadRule::NumPoints(*ppQVar2);
  }
  Ne3 = local_4b8;
  pvVar1 = std::array<unsigned_int,_4UL>::operator[](&this->edge_degrees_,2);
  if (*pvVar1 < 2) {
    local_4bc = 0;
  }
  else {
    ppQVar2 = std::array<const_lf::quad::QuadRule_*,_4UL>::operator[](&this->qr_dual_edge_,2);
    local_4bc = quad::QuadRule::NumPoints(*ppQVar2);
  }
  Nq = local_4bc;
  pvVar1 = std::array<unsigned_int,_4UL>::operator[](&this->edge_degrees_,3);
  if (*pvVar1 < 2) {
    local_4c0 = 0;
  }
  else {
    ppQVar2 = std::array<const_lf::quad::QuadRule_*,_4UL>::operator[](&this->qr_dual_edge_,3);
    local_4c0 = quad::QuadRule::NumPoints(*ppQVar2);
  }
  local_28 = local_4c0;
  if (this->interior_degree_ < 2) {
    local_4c4 = 0;
  }
  else {
    local_4c4 = FeHierarchicSegment<double>::NumEvaluationNodes(&this->fe1d_);
  }
  local_2c = local_4c4;
  local_2d = 0;
  local_38[1] = 2;
  local_38[0] = local_4c4 * local_4c4 + 4 + Ne2 + Ne3 + Nq + local_28;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_int>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,(int *)(local_38 + 1),local_38);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      __return_storage_ptr__,0,0);
  *pSVar3 = 0.0;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      __return_storage_ptr__,1,0);
  *pSVar3 = 0.0;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      __return_storage_ptr__,0,1);
  *pSVar3 = 1.0;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      __return_storage_ptr__,1,1);
  *pSVar3 = 0.0;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      __return_storage_ptr__,0,2);
  *pSVar3 = 1.0;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      __return_storage_ptr__,1,2);
  *pSVar3 = 1.0;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      __return_storage_ptr__,0,3);
  *pSVar3 = 0.0;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      __return_storage_ptr__,1,3);
  *pSVar3 = 1.0;
  pvVar1 = std::array<unsigned_int,_4UL>::operator[](&this->edge_degrees_,0);
  if (1 < *pvVar1) {
    peVar4 = std::span<const_lf::mesh::Orientation,_18446744073709551615UL>::operator[]
                       (&this->rel_orient_,0);
    if (*peVar4 == positive) {
      ppQVar2 = std::array<const_lf::quad::QuadRule_*,_4UL>::operator[](&this->qr_dual_edge_,0);
      pDVar5 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
               quad::QuadRule::Points(*ppQVar2);
      Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,unsigned_int>
                (&local_80,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__,
                 0,4,1,Ne2);
      Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false> *)&local_80,pDVar5);
    }
    else {
      Eigen::DenseBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::Ones(&local_c8,(ulong)Ne2);
      ppQVar2 = std::array<const_lf::quad::QuadRule_*,_4UL>::operator[](&this->qr_dual_edge_,0);
      pMVar6 = (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
               quad::QuadRule::Points(*ppQVar2);
      Eigen::
      MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,-1,1,1,-1>>>
      ::operator-(&local_b0,
                  (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,_1,1,1,_1>>>
                   *)&local_c8,pMVar6);
      Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,unsigned_int>
                (&local_100,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__
                 ,0,4,1,Ne2);
      Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false> *)&local_100,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_b0);
    }
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,unsigned_int>
              (&local_138,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__,1
               ,4,1,Ne2);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
    setZero((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
            &local_138);
  }
  pvVar1 = std::array<unsigned_int,_4UL>::operator[](&this->edge_degrees_,1);
  if (1 < *pvVar1) {
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,unsigned_int>
              (&local_170,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__,0
               ,(ulong)(Ne2 + 4),1,Ne3);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
    setOnes((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
            &local_170);
    peVar4 = std::span<const_lf::mesh::Orientation,_18446744073709551615UL>::operator[]
                       (&this->rel_orient_,1);
    if (*peVar4 == positive) {
      ppQVar2 = std::array<const_lf::quad::QuadRule_*,_4UL>::operator[](&this->qr_dual_edge_,1);
      pDVar5 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
               quad::QuadRule::Points(*ppQVar2);
      Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,unsigned_int>
                (&local_1a8,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__
                 ,1,(ulong)(Ne2 + 4),1,Ne3);
      Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false> *)&local_1a8,pDVar5);
    }
    else {
      Eigen::DenseBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::Ones(&local_1f0,(ulong)Ne3);
      ppQVar2 = std::array<const_lf::quad::QuadRule_*,_4UL>::operator[](&this->qr_dual_edge_,1);
      pMVar6 = (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
               quad::QuadRule::Points(*ppQVar2);
      Eigen::
      MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,-1,1,1,-1>>>
      ::operator-(&local_1d8,
                  (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,_1,1,1,_1>>>
                   *)&local_1f0,pMVar6);
      Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,unsigned_int>
                (&local_228,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__
                 ,1,(ulong)(Ne2 + 4),1,Ne3);
      Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false> *)&local_228,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_1d8);
    }
  }
  pvVar1 = std::array<unsigned_int,_4UL>::operator[](&this->edge_degrees_,2);
  if (1 < *pvVar1) {
    peVar4 = std::span<const_lf::mesh::Orientation,_18446744073709551615UL>::operator[]
                       (&this->rel_orient_,2);
    if (*peVar4 == positive) {
      Eigen::DenseBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::Ones(&local_270,(ulong)Nq);
      ppQVar2 = std::array<const_lf::quad::QuadRule_*,_4UL>::operator[](&this->qr_dual_edge_,2);
      pMVar6 = (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
               quad::QuadRule::Points(*ppQVar2);
      Eigen::
      MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,-1,1,1,-1>>>
      ::operator-(&local_258,
                  (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,_1,1,1,_1>>>
                   *)&local_270,pMVar6);
      Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,unsigned_int>
                (&local_2a8,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__
                 ,0,(ulong)(Ne2 + 4 + Ne3),1,Nq);
      Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false> *)&local_2a8,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_258);
    }
    else {
      ppQVar2 = std::array<const_lf::quad::QuadRule_*,_4UL>::operator[](&this->qr_dual_edge_,2);
      pDVar5 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
               quad::QuadRule::Points(*ppQVar2);
      Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,unsigned_int>
                (&local_2e0,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__
                 ,0,(ulong)(Ne2 + 4 + Ne3),1,Nq);
      Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false> *)&local_2e0,pDVar5);
    }
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,unsigned_int>
              (&local_318,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__,1
               ,(ulong)(Ne2 + 4 + Ne3),1,Nq);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
    setOnes((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
            &local_318);
  }
  pvVar1 = std::array<unsigned_int,_4UL>::operator[](&this->edge_degrees_,3);
  if (1 < *pvVar1) {
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,unsigned_int>
              (&local_350,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__,0
               ,(ulong)(Nq + 4 + Ne2 + Ne3),1,local_28);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
    setZero((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
            &local_350);
    peVar4 = std::span<const_lf::mesh::Orientation,_18446744073709551615UL>::operator[]
                       (&this->rel_orient_,3);
    if (*peVar4 == positive) {
      Eigen::DenseBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::Ones(&local_398,(ulong)local_28);
      ppQVar2 = std::array<const_lf::quad::QuadRule_*,_4UL>::operator[](&this->qr_dual_edge_,3);
      pMVar6 = (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
               quad::QuadRule::Points(*ppQVar2);
      Eigen::
      MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,-1,1,1,-1>>>
      ::operator-(&local_380,
                  (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,_1,1,1,_1>>>
                   *)&local_398,pMVar6);
      Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,unsigned_int>
                (&local_3d0,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__
                 ,1,(ulong)(Nq + 4 + Ne2 + Ne3),1,local_28);
      Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false> *)&local_3d0,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_380);
    }
    else {
      ppQVar2 = std::array<const_lf::quad::QuadRule_*,_4UL>::operator[](&this->qr_dual_edge_,3);
      pDVar5 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
               quad::QuadRule::Points(*ppQVar2);
      Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,unsigned_int>
                ((Type *)&points.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                          m_storage.m_cols,
                 (DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__,1,
                 (ulong)(Nq + 4 + Ne2 + Ne3),1,local_28);
      Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false> *)
                 &points.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_cols,pDVar5);
    }
  }
  if (1 < this->interior_degree_) {
    FeHierarchicSegment<double>::EvaluationNodes((MatrixXd *)local_420,&this->fe1d_);
    for (local_424 = 0; local_424 < local_2c; local_424 = local_424 + 1) {
      Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,unsigned_int>
                (&local_460,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__
                 ,0,(ulong)(local_424 * local_2c + 4 + Ne2 + Ne3 + Nq + local_28),1,local_2c);
      Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false> *)&local_460,
                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_420);
      Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,unsigned_int>
                (&local_498,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__
                 ,1,(ulong)(local_424 * local_2c + 4 + Ne2 + Ne3 + Nq + local_28),1,local_2c);
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_420,
                          0,(ulong)local_424);
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
      setConstant((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                   *)&local_498,pSVar3);
    }
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)local_420);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] Eigen::MatrixXd EvaluationNodes() const override {
    const base::size_type Ne0 =
        edge_degrees_[0] > 1 ? qr_dual_edge_[0]->NumPoints() : 0;
    const base::size_type Ne1 =
        edge_degrees_[1] > 1 ? qr_dual_edge_[1]->NumPoints() : 0;
    const base::size_type Ne2 =
        edge_degrees_[2] > 1 ? qr_dual_edge_[2]->NumPoints() : 0;
    const base::size_type Ne3 =
        edge_degrees_[3] > 1 ? qr_dual_edge_[3]->NumPoints() : 0;
    auto Nq = interior_degree_ > 1 ? fe1d_.NumEvaluationNodes() : 0;

    Eigen::MatrixXd nodes(2, 4 + Ne0 + Ne1 + Ne2 + Ne3 + Nq * Nq);
    // Add the vertices
    nodes(0, 0) = 0;
    nodes(1, 0) = 0;
    nodes(0, 1) = 1;
    nodes(1, 1) = 0;
    nodes(0, 2) = 1;
    nodes(1, 2) = 1;
    nodes(0, 3) = 0;
    nodes(1, 3) = 1;
    if (edge_degrees_[0] > 1) {
      // Add the quadrature points on the first edge
      if (rel_orient_[0] == lf::mesh::Orientation::positive) {
        nodes.block(0, 4, 1, Ne0) = qr_dual_edge_[0]->Points();
      } else {
        nodes.block(0, 4, 1, Ne0) =
            Eigen::RowVectorXd::Ones(Ne0) - qr_dual_edge_[0]->Points();
      }
      nodes.block(1, 4, 1, Ne0).setZero();
    }

    if (edge_degrees_[1] > 1) {
      // Add the quadrature points on the second edge
      nodes.block(0, 4 + Ne0, 1, Ne1).setOnes();
      if (rel_orient_[1] == lf::mesh::Orientation::positive) {
        nodes.block(1, 4 + Ne0, 1, Ne1) = qr_dual_edge_[1]->Points();
      } else {
        nodes.block(1, 4 + Ne0, 1, Ne1) =
            Eigen::RowVectorXd::Ones(Ne1) - qr_dual_edge_[1]->Points();
      }
    }
    if (edge_degrees_[2] > 1) {
      // Add the quadrature points on the third edge
      if (rel_orient_[2] == lf::mesh::Orientation::positive) {
        nodes.block(0, 4 + Ne0 + Ne1, 1, Ne2) =
            Eigen::RowVectorXd::Ones(Ne2) - qr_dual_edge_[2]->Points();
      } else {
        nodes.block(0, 4 + Ne0 + Ne1, 1, Ne2) = qr_dual_edge_[2]->Points();
      }
      nodes.block(1, 4 + Ne0 + Ne1, 1, Ne2).setOnes();
    }
    if (edge_degrees_[3] > 1) {
      // Add the quadrature points on the fourth edge
      nodes.block(0, 4 + Ne0 + Ne1 + Ne2, 1, Ne3).setZero();
      if (rel_orient_[3] == lf::mesh::Orientation::positive) {
        nodes.block(1, 4 + Ne0 + Ne1 + Ne2, 1, Ne3) =
            Eigen::RowVectorXd::Ones(Ne3) - qr_dual_edge_[3]->Points();
      } else {
        nodes.block(1, 4 + Ne0 + Ne1 + Ne2, 1, Ne3) =
            qr_dual_edge_[3]->Points();
      }
    }
    if (interior_degree_ > 1) {
      // Add the quadrature points for the face
      auto points = fe1d_.EvaluationNodes();
      for (lf::base::size_type i = 0; i < Nq; ++i) {
        nodes.block(0, 4 + Ne0 + Ne1 + Ne2 + Ne3 + i * Nq, 1, Nq) = points;
        nodes.block(1, 4 + Ne0 + Ne1 + Ne2 + Ne3 + i * Nq, 1, Nq)
            .setConstant(points(0, i));
      }
    }
    return nodes;
  }